

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::delete_transform_feedbacks
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  NegativeTestContext *pNVar2;
  deUint32 dVar3;
  RenderContext *renderCtx;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1e9;
  string local_1e8;
  ProgramSources local_1c8;
  undefined1 local_f8 [8];
  ShaderProgram program;
  char *tfVarying;
  deUint32 buf;
  GLuint tfID [2];
  GLuint id;
  NegativeTestContext *ctx_local;
  
  tfID[0] = 0;
  tfVarying._0_4_ = 0x1234;
  program.m_program.m_info.linkTimeUs = (long)"gl_in[0].gl_Position" + 9;
  unique0x10000553 = ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,puVar1,&local_1e9);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,puVar1,&local_221);
  glu::makeVtxFragSources(&local_1c8,&local_1e8,&local_220);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,renderCtx,&local_1c8);
  glu::ProgramSources::~ProgramSources(&local_1c8);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  glu::CallLogWrapper::glGenBuffers
            (&stack0xfffffffffffffff0->super_CallLogWrapper,1,(GLuint *)&tfVarying);
  glu::CallLogWrapper::glGenTransformFeedbacks
            (&stack0xfffffffffffffff0->super_CallLogWrapper,1,tfID);
  glu::CallLogWrapper::glGenTransformFeedbacks
            (&stack0xfffffffffffffff0->super_CallLogWrapper,2,(GLuint *)((long)&tfVarying + 4));
  pNVar2 = stack0xfffffffffffffff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"GL_INVALID_VALUE is generated if n is negative.",&local_249);
  NegativeTestContext::beginSection(pNVar2,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&stack0xfffffffffffffff0->super_CallLogWrapper,-1,tfID);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x501);
  NegativeTestContext::endSection(stack0xfffffffffffffff0);
  pNVar2 = stack0xfffffffffffffff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "GL_INVALID_OPERATION is generated if the transform feedback operation for any object named by ids is currently active."
             ,&local_271);
  NegativeTestContext::beginSection(pNVar2,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pNVar2 = stack0xfffffffffffffff0;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
  glu::CallLogWrapper::glUseProgram(&pNVar2->super_CallLogWrapper,dVar3);
  pNVar2 = stack0xfffffffffffffff0;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&pNVar2->super_CallLogWrapper,dVar3,1,(GLchar **)&program.m_program.m_info.linkTimeUs,
             0x8c8c);
  pNVar2 = stack0xfffffffffffffff0;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
  glu::CallLogWrapper::glLinkProgram(&pNVar2->super_CallLogWrapper,dVar3);
  glu::CallLogWrapper::glBindTransformFeedback
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8e22,tfVarying._4_4_);
  glu::CallLogWrapper::glBindBuffer
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c8e,(GLuint)tfVarying);
  glu::CallLogWrapper::glBufferData
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBufferBase
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c8e,0,(GLuint)tfVarying);
  glu::CallLogWrapper::glBeginTransformFeedback(&stack0xfffffffffffffff0->super_CallLogWrapper,4);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  glu::CallLogWrapper::glBindTransformFeedback
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8e22,buf);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&stack0xfffffffffffffff0->super_CallLogWrapper,2,(GLuint *)((long)&tfVarying + 4));
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glEndTransformFeedback(&stack0xfffffffffffffff0->super_CallLogWrapper);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  NegativeTestContext::endSection(stack0xfffffffffffffff0);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&stack0xfffffffffffffff0->super_CallLogWrapper,1,tfID);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&stack0xfffffffffffffff0->super_CallLogWrapper,2,(GLuint *)((long)&tfVarying + 4));
  glu::CallLogWrapper::glDeleteBuffers
            (&stack0xfffffffffffffff0->super_CallLogWrapper,1,(GLuint *)&tfVarying);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
  return;
}

Assistant:

void delete_transform_feedbacks (NegativeTestContext& ctx)
{
	GLuint				id			= 0;
	GLuint				tfID[2];
	deUint32			buf			= 0x1234;
	const char*			tfVarying	= "gl_Position";
	glu::ShaderProgram	program		(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	ctx.glGenBuffers(1, &buf);
	ctx.glGenTransformFeedbacks(1, &id);
	ctx.glGenTransformFeedbacks(2, tfID);

	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	ctx.glDeleteTransformFeedbacks(-1, &id);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the transform feedback operation for any object named by ids is currently active.");
	ctx.glUseProgram(program.getProgram());
	ctx.glTransformFeedbackVaryings(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.glLinkProgram(program.getProgram());
	ctx.glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfID[0]);
	ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
	ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
	ctx.glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.glBeginTransformFeedback(GL_TRIANGLES);
	ctx.expectError(GL_NO_ERROR);

	ctx.glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfID[1]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glDeleteTransformFeedbacks(2, tfID);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glEndTransformFeedback();
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();


	ctx.glDeleteTransformFeedbacks(1, &id);
	ctx.glDeleteTransformFeedbacks(2, tfID);
	ctx.glDeleteBuffers(1, &buf);

}